

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomign(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  matches *pmVar1;
  
  if (ctx->reverse != 0) {
    pmVar1 = alwaysmatches(spos);
    return pmVar1;
  }
  bf_(*v,*(int *)((long)v + 4),a,m);
  return (matches *)0x0;
}

Assistant:

struct matches *atomign APROTO {
	if (ctx->reverse)
		return alwaysmatches(spos);
	const int *n = v;
	(void)BF(n[0], n[1]);
	return NULL;
}